

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,decimal_fp<double> *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  uint uVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  significand_type **ppsVar8;
  significand_type **ppsVar9;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  pointer __s;
  pointer pcVar10;
  int iVar11;
  pointer pcVar12;
  long lVar13;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_7_ef14d3db write;
  undefined1 local_7d [5];
  sign_t local_78;
  int local_74;
  undefined1 local_70 [8];
  significand_type *local_68;
  undefined1 local_5c [8];
  undefined4 uStack_54;
  significand_type **local_50;
  undefined8 local_48;
  undefined8 local_40;
  float_specs *local_38;
  significand_type **local_30;
  int *local_28;
  
  local_68 = (significand_type *)fp->significand;
  lVar13 = 0x3f;
  if (((ulong)local_68 | 1) != 0) {
    for (; ((ulong)local_68 | 1) >> lVar13 == 0; lVar13 = lVar13 + -1) {
    }
  }
  local_74 = (uint)*(ushort *)(bsr2log10(int)::data + (uint)((int)lVar13 * 2)) -
             (uint)(local_68 <
                   *(significand_type **)
                    (basic_data<void>::zero_or_powers_of_10_64_new +
                    (ulong)*(ushort *)(bsr2log10(int)::data + (uint)((int)lVar13 * 2)) * 8));
  local_70._4_4_ = fspecs._4_4_;
  local_78 = (uint)local_70._4_4_ >> 8 & 0xff;
  uVar7 = (ulong)((uint)(local_78 != none) + local_74);
  uVar1 = fp->exponent;
  local_5c._0_4_ = uVar1 + local_74;
  local_70._0_4_ = fspecs.precision;
  local_7d[0] = decimal_point;
  local_70 = (undefined1  [8])fspecs;
  if (fspecs._4_1_ == '\x01') {
LAB_001524ad:
    iVar11 = uVar1 + local_74 + -1;
    if (((uint)local_70._4_4_ >> 0x14 & 1) == 0) {
      uVar5 = 0;
      if (local_74 == 1) {
        local_7d[0] = '\0';
      }
    }
    else {
      uVar5 = 0;
      if (0 < local_70._0_4_ - local_74) {
        uVar5 = (ulong)(uint)(local_70._0_4_ - local_74);
      }
      uVar7 = uVar7 + uVar5;
    }
    iVar4 = 1 - local_5c._0_4_;
    if (0 < (int)local_5c._0_4_) {
      iVar4 = iVar11;
    }
    lVar13 = 2;
    if (99 < iVar4) {
      lVar13 = (ulong)(999 < iVar4) + 3;
    }
    sVar6 = (3 - (ulong)(local_7d[0] == '\0')) + uVar7 + lVar13;
    stack0xffffffffffffffa8 =
         (sign_t *)(CONCAT44(uStack_54,(uint)local_70._4_4_ >> 8) & 0xffffffff000000ff);
    local_48._0_5_ = CONCAT14(local_7d[0],local_74);
    local_40 = (decimal_fp<double> *)
               (CONCAT35(local_40._5_3_,
                         CONCAT14((((uint)local_70._4_4_ >> 0x10 & 1) == 0) << 5,(int)uVar5)) |
               0x4500000000);
    local_38 = (float_specs *)CONCAT44(local_38._4_4_,iVar11);
    local_50 = (significand_type **)local_68;
    if (specs->width < 1) {
      sVar2 = (out.container)->_M_string_length;
      std::__cxx11::string::resize((ulong)out.container,(char)sVar6 + (char)sVar2);
      pcVar12 = ((out.container)->_M_dataplus)._M_p + sVar2;
      if (((ulong)stack0xffffffffffffffa8 & 0xffffffff) != 0) {
        *pcVar12 = *(char *)((long)&basic_data<void>::signs +
                            ((ulong)stack0xffffffffffffffa8 & 0xffffffff));
        pcVar12 = pcVar12 + 1;
      }
      if (local_48._4_1_ == '\0') {
        __s = pcVar12 + (int)local_48;
        ppsVar8 = local_50;
        ppsVar9 = local_50;
        pcVar12 = __s;
        if ((significand_type *)0x63 < local_50) {
          do {
            ppsVar9 = (significand_type **)((ulong)ppsVar8 / 100);
            *(undefined2 *)(pcVar12 + -2) =
                 *(undefined2 *)(basic_data<void>::digits + ((ulong)ppsVar8 % 100) * 2);
            pcVar12 = pcVar12 + -2;
            bVar3 = (significand_type *)0x270f < ppsVar8;
            ppsVar8 = ppsVar9;
          } while (bVar3);
        }
        if (ppsVar9 < (significand_type *)0xa) {
          pcVar12[-1] = (byte)ppsVar9 | 0x30;
        }
        else {
          *(undefined2 *)(pcVar12 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (long)ppsVar9 * 2);
        }
      }
      else {
        __s = pcVar12 + (long)(int)local_48 + 1;
        ppsVar8 = local_50;
        ppsVar9 = local_50;
        pcVar10 = __s;
        if ((significand_type *)0x63 < local_50) {
          do {
            ppsVar9 = (significand_type **)((ulong)ppsVar8 / 100);
            *(undefined2 *)(pcVar10 + -2) =
                 *(undefined2 *)(basic_data<void>::digits + ((ulong)ppsVar8 % 100) * 2);
            pcVar10 = pcVar10 + -2;
            bVar3 = (significand_type *)0x270f < ppsVar8;
            ppsVar8 = ppsVar9;
          } while (bVar3);
        }
        if (ppsVar9 < (significand_type *)0xa) {
          pcVar10[-1] = (byte)ppsVar9 | 0x30;
        }
        else {
          *(undefined2 *)(pcVar10 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (long)ppsVar9 * 2);
        }
        *pcVar12 = pcVar12[1];
        pcVar12[1] = local_48._4_1_;
      }
      __n = (size_t)(int)local_40;
      pcVar12 = __s;
      if (0 < (long)__n) {
        pcVar12 = __s + __n;
        memset(__s,0x30,__n);
      }
      *pcVar12 = local_40._4_1_;
      write_exponent<char,char*>((int)local_38,pcVar12 + 1);
    }
    else {
      out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                      (out,specs,sVar6,sVar6,(anon_class_40_7_ef14d3db *)(local_5c + 4));
    }
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      iVar11 = 0x10;
      if (0 < (int)local_70._0_4_) {
        iVar11 = local_70._0_4_;
      }
      if (((int)local_5c._0_4_ < -3) || (iVar11 < (int)local_5c._0_4_)) goto LAB_001524ad;
    }
    if ((int)uVar1 < 0) {
      if ((int)local_5c._0_4_ < 1) {
        iVar11 = -local_5c._0_4_;
        local_40 = (decimal_fp<double> *)local_70;
        local_7d._1_4_ = iVar11;
        if (SBORROW4(local_70._0_4_,iVar11) != (int)(local_70._0_4_ + local_5c._0_4_) < 0) {
          local_7d._1_4_ = local_70._0_4_;
        }
        if ((int)local_70._0_4_ < 0) {
          local_7d._1_4_ = iVar11;
        }
        if (local_74 != 0) {
          local_7d._1_4_ = iVar11;
        }
        local_50 = (significand_type **)((long)local_7d + 1);
        sVar6 = (local_7d._1_4_ + 2) + uVar7;
        unique0x00004e80 = &local_78;
        local_48 = &local_74;
        local_38 = (float_specs *)local_7d;
        local_30 = &local_68;
        out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_&>
                        (out,specs,sVar6,sVar6,(anon_class_48_6_9afe1116 *)(local_5c + 4));
      }
      else {
        local_7d._1_4_ = local_70._0_4_ - local_74 & (int)(local_70._4_4_ << 0xb) >> 0x1f;
        local_30 = (significand_type **)((long)local_7d + 1);
        uVar5 = (ulong)(uint)local_7d._1_4_;
        if ((int)local_7d._1_4_ < 1) {
          uVar5 = 0;
        }
        sVar6 = uVar5 + 1 + uVar7;
        unique0x00004e80 = &local_78;
        local_50 = &local_68;
        local_48 = &local_74;
        local_40 = (decimal_fp<double> *)local_5c;
        local_38 = (float_specs *)local_7d;
        out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_&>
                        (out,specs,sVar6,sVar6,(anon_class_48_6_48d028d1 *)(local_5c + 4));
      }
    }
    else {
      sVar6 = uVar7 + uVar1;
      local_7d._1_4_ = local_70._0_4_ - local_5c._0_4_;
      if (((uint)local_70._4_4_ >> 0x14 & 1) != 0) {
        if ((fspecs._4_1_ != '\x02') && ((int)local_7d._1_4_ < 1)) {
          local_7d._1_4_ = 1;
        }
        if (0 < (long)(int)local_7d._1_4_) {
          sVar6 = sVar6 + (long)(int)local_7d._1_4_;
        }
      }
      unique0x00004e80 = &local_78;
      local_50 = &local_68;
      local_48 = &local_74;
      local_38 = (float_specs *)local_70;
      local_30 = (significand_type **)local_7d;
      local_28 = (int *)((long)local_7d + 1);
      local_40 = fp;
      out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_&>
                      (out,specs,sVar6,sVar6,(anon_class_56_7_a2a26a24 *)(local_5c + 4));
    }
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}